

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.h
# Opt level: O0

uint16 CalcCRCSBG(void *pBuffer,uint16 bufferSize)

{
  ushort uVar1;
  undefined2 local_28;
  undefined1 local_26;
  undefined2 local_24;
  uint16 j;
  uint8 i_bits;
  uint8 carry;
  uint16 crc;
  uint16 poly;
  uint8 *pBytesArray;
  uint16 bufferSize_local;
  void *pBuffer_local;
  
  local_24 = 0;
  for (local_28 = 0; local_28 < bufferSize; local_28 = local_28 + 1) {
    local_24 = local_24 ^ *(byte *)((long)pBuffer + (ulong)local_28);
    for (local_26 = 0; local_26 < 8; local_26 = local_26 + 1) {
      uVar1 = local_24 & 1;
      local_24 = local_24 / 2;
      if (uVar1 != 0) {
        local_24 = local_24 ^ 0x8408;
      }
    }
  }
  return local_24;
}

Assistant:

inline uint16 CalcCRCSBG(const void *pBuffer, uint16 bufferSize)
{
	const uint8 *pBytesArray = (const uint8*)pBuffer;
	uint16 poly = 0x8408;
	uint16 crc = 0;
	uint8 carry;
	uint8 i_bits;
	uint16 j;
	for (j =0; j < bufferSize; j++)
	{
		crc = crc ^ pBytesArray[j];
		for (i_bits = 0; i_bits < 8; i_bits++)
		{
			carry = crc & 1;
			crc = crc / 2;
			if (carry)
			{
				crc = crc^poly;
			}
		}
	}
	return crc;
}